

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::JsonUnitTestResultPrinter::PrintJsonTestList
               (ostream *stream,
               vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *test_suites)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppTVar2;
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  ostream *poVar6;
  pointer ppTVar7;
  ulong uVar8;
  long lVar9;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  int value;
  undefined1 auVar18 [64];
  string kIndent;
  string kTestsuites;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  undefined1 auVar12 [32];
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"testsuites","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_b0,'\x02');
  std::__ostream_insert<char,std::char_traits<char>>(stream,"{\n",2);
  ppTVar7 = (test_suites->
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>)._M_impl
            .super__Vector_impl_data._M_start;
  ppTVar2 = (test_suites->
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  if (ppTVar7 == ppTVar2) {
    value = 0;
  }
  else {
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    uVar8 = 0;
    auVar14 = vpbroadcastq_avx512f();
    auVar15 = vpsrlq_avx512f(auVar14,3);
    auVar14 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar18 = auVar14;
      auVar14 = vpbroadcastq_avx512f();
      auVar14 = vporq_avx512f(auVar14,auVar13);
      uVar5 = vpcmpuq_avx512f(auVar14,auVar15,2);
      vmovdqu64_avx512f(*(undefined1 (*) [64])(ppTVar7 + uVar8));
      uVar8 = uVar8 + 8;
      auVar14 = vpgatherqq_avx512f(*(undefined8 *)(stream + 0x38));
      bVar4 = (byte)uVar5;
      auVar16._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar14._8_8_;
      auVar16._0_8_ = (ulong)(bVar4 & 1) * auVar14._0_8_;
      auVar16._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar14._16_8_;
      auVar16._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar14._24_8_;
      auVar16._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar14._32_8_;
      auVar16._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar14._40_8_;
      auVar16._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar14._48_8_;
      auVar16._56_8_ = (uVar5 >> 7) * auVar14._56_8_;
      auVar14 = vpgatherqq_avx512f(*(undefined8 *)(stream + 0x30));
      auVar17._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar14._8_8_;
      auVar17._0_8_ = (ulong)(bVar4 & 1) * auVar14._0_8_;
      auVar17._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar14._16_8_;
      auVar17._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar14._24_8_;
      auVar17._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar14._32_8_;
      auVar17._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar14._40_8_;
      auVar17._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar14._48_8_;
      auVar17._56_8_ = (uVar5 >> 7) * auVar14._56_8_;
      auVar14 = vpsubq_avx512f(auVar16,auVar17);
      auVar14 = vpsrlq_avx512f(auVar14,3);
      auVar11 = vpmovqd_avx512f(auVar14);
      auVar11 = vpaddd_avx2(auVar18._0_32_,auVar11);
      auVar14 = ZEXT3264(auVar11);
    } while ((((ulong)((long)ppTVar2 + (-8 - (long)ppTVar7)) >> 3) + 8 & 0xfffffffffffffff8) !=
             uVar8);
    auVar11 = vmovdqa32_avx512vl(auVar11);
    auVar10._0_4_ = (uint)(bVar4 & 1) * auVar11._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar18._0_4_;
    bVar3 = (bool)((byte)(uVar5 >> 1) & 1);
    auVar10._4_4_ = (uint)bVar3 * auVar11._4_4_ | (uint)!bVar3 * auVar18._4_4_;
    bVar3 = (bool)((byte)(uVar5 >> 2) & 1);
    auVar10._8_4_ = (uint)bVar3 * auVar11._8_4_ | (uint)!bVar3 * auVar18._8_4_;
    bVar3 = (bool)((byte)(uVar5 >> 3) & 1);
    auVar10._12_4_ = (uint)bVar3 * auVar11._12_4_ | (uint)!bVar3 * auVar18._12_4_;
    bVar3 = (bool)((byte)(uVar5 >> 4) & 1);
    auVar12._16_4_ = (uint)bVar3 * auVar11._16_4_ | (uint)!bVar3 * auVar18._16_4_;
    auVar12._0_16_ = auVar10;
    bVar3 = (bool)((byte)(uVar5 >> 5) & 1);
    auVar12._20_4_ = (uint)bVar3 * auVar11._20_4_ | (uint)!bVar3 * auVar18._20_4_;
    bVar3 = (bool)((byte)(uVar5 >> 6) & 1);
    auVar12._24_4_ = (uint)bVar3 * auVar11._24_4_ | (uint)!bVar3 * auVar18._24_4_;
    bVar3 = SUB81(uVar5 >> 7,0);
    auVar12._28_4_ = (uint)bVar3 * auVar11._28_4_ | (uint)!bVar3 * auVar18._28_4_;
    auVar10 = vphaddd_avx(auVar12._16_16_,auVar10);
    auVar10 = vphaddd_avx(auVar10,auVar10);
    auVar10 = vphaddd_avx(auVar10,auVar10);
    value = auVar10._0_4_;
  }
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"tests","");
  OutputJsonKey(stream,&local_70,&local_90,value,&local_b0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"name","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"AllTests","");
  OutputJsonKey(stream,&local_70,&local_90,&local_50,&local_b0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\": [\n",5);
  ppTVar7 = (test_suites->
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>)._M_impl
            .super__Vector_impl_data._M_start;
  if ((test_suites->super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>)
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar7) {
    lVar9 = 0;
    uVar8 = 0;
    do {
      if (uVar8 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
        ppTVar7 = (pointer)((long)(test_suites->
                                  super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                  )._M_impl.super__Vector_impl_data._M_start + lVar9);
      }
      PrintJsonTestSuite(stream,*ppTVar7);
      ppTVar7 = (test_suites->
                super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 8;
    } while (uVar8 < (ulong)((long)(test_suites->
                                   super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar7 >> 3)
            );
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonTestList(
    std::ostream* stream, const std::vector<TestSuite*>& test_suites) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";
  int total_tests = 0;
  for (auto test_suite : test_suites) {
    total_tests += test_suite->total_test_count();
  }
  OutputJsonKey(stream, kTestsuites, "tests", total_tests, kIndent);

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  for (size_t i = 0; i < test_suites.size(); ++i) {
    if (i != 0) {
      *stream << ",\n";
    }
    PrintJsonTestSuite(stream, *test_suites[i]);
  }

  *stream << "\n"
          << kIndent << "]\n"
          << "}\n";
}